

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
                    uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
                    uint16_t *algorithms,size_t num_algorithms)

{
  EVP_PKEY *pkey;
  uint8_t *puVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  ptls_openssl_signature_scheme_t *ppVar5;
  EVP_MD *type;
  EVP_MD_CTX *ctx;
  ptls_async_job_t *ppVar6;
  _func_void_st_ptls_async_job_t_ptr__func_void_void_ptr_ptr_void_ptr *p_Var7;
  int iVar8;
  ptls_buffer_t *ppVar9;
  _func_int_st_ptls_async_job_t_ptr *local_58;
  ptls_buffer_t *local_50;
  EVP_PKEY_CTX *pkey_ctx;
  uint8_t *local_40;
  size_t local_38;
  
  if ((async != (ptls_async_job_t **)0x0) && (*async != (ptls_async_job_t *)0x0)) {
    *selected_algorithm = *(uint16_t *)(*async)[1].destroy_;
    iVar3 = do_sign_async(outbuf,async);
    return iVar3;
  }
  ppVar5 = ptls_openssl_select_signature_scheme
                     ((ptls_openssl_signature_scheme_t *)_self[2].cb,algorithms,num_algorithms);
  if (ppVar5 == (ptls_openssl_signature_scheme_t *)0x0) {
    return 0x28;
  }
  *selected_algorithm = ppVar5->scheme_id;
  if ((async != (ptls_async_job_t **)0x0) && (((ulong)_self[3].cb & 1) == 0)) {
    if (*async != (ptls_async_job_t *)0x0) {
      __assert_fail("*async == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c",
                    0x5ea,
                    "int sign_certificate(ptls_sign_certificate_t *, ptls_t *, ptls_async_job_t **, uint16_t *, ptls_buffer_t *, ptls_iovec_t, const uint16_t *, size_t)"
                   );
    }
    async = (ptls_async_job_t **)0x0;
  }
  pkey = (EVP_PKEY *)_self[1].cb;
  local_40 = input.base;
  local_38 = input.len;
  if (ppVar5->scheme_md == (_func_EVP_MD_ptr *)0x0) {
    type = (EVP_MD *)0x0;
  }
  else {
    type = (EVP_MD *)(*ppVar5->scheme_md)();
  }
  ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
  if (ctx == (EVP_MD_CTX *)0x0) {
    return 0x201;
  }
  local_50 = outbuf;
  iVar4 = EVP_DigestSignInit(ctx,(EVP_PKEY_CTX **)&pkey_ctx,type,(ENGINE *)0x0,pkey);
  iVar8 = 0x203;
  iVar3 = iVar8;
  if (iVar4 != 1) goto LAB_0011e31b;
  iVar4 = EVP_PKEY_get_id(pkey);
  sVar2 = local_38;
  puVar1 = local_40;
  if (iVar4 == 0x43f) {
    iVar4 = EVP_DigestSign(ctx,0,&local_58,local_40,local_38);
    ppVar9 = local_50;
    if ((iVar4 != 1) || (iVar3 = ptls_buffer_reserve(local_50,(size_t)local_58), iVar3 != 0))
    goto LAB_0011e31b;
    iVar4 = EVP_DigestSign(ctx,ppVar9->base + ppVar9->off,&local_58,puVar1,sVar2);
  }
  else {
    iVar4 = EVP_PKEY_get_id(pkey);
    if (((iVar4 == 6) &&
        (((iVar4 = EVP_PKEY_CTX_set_rsa_padding(pkey_ctx,6), iVar4 != 1 ||
          (iVar4 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pkey_ctx,0xffffffffffffffff), iVar4 != 1)) ||
         (iVar4 = EVP_PKEY_CTX_set_rsa_mgf1_md(pkey_ctx,type), iVar4 != 1)))) ||
       ((iVar4 = EVP_DigestSignUpdate(ctx,local_40,local_38), iVar4 != 1 ||
        (iVar4 = EVP_DigestSignFinal(ctx,(uchar *)0x0,(size_t *)&local_58), ppVar9 = local_50,
        iVar4 != 1)))) goto LAB_0011e31b;
    if (async != (ptls_async_job_t **)0x0) {
      ppVar6 = (ptls_async_job_t *)malloc((size_t)(local_58 + 0x40));
      if (ppVar6 != (ptls_async_job_t *)0x0) {
        ppVar6->destroy_ = async_sign_ctx_free;
        ppVar6->get_fd = async_sign_ctx_get_fd;
        ppVar6->set_completion_callback =
             (_func_void_st_ptls_async_job_t_ptr__func_void_void_ptr_ptr_void_ptr *)0x0;
        ppVar6[1].destroy_ = (_func_void_st_ptls_async_job_t_ptr *)ppVar5;
        ppVar6[1].get_fd = (_func_int_st_ptls_async_job_t_ptr *)ctx;
        p_Var7 = (_func_void_st_ptls_async_job_t_ptr__func_void_void_ptr_ptr_void_ptr *)
                 ASYNC_WAIT_CTX_new();
        ppVar6[1].set_completion_callback = p_Var7;
        ppVar6[2].destroy_ = (_func_void_st_ptls_async_job_t_ptr *)0x0;
        ppVar6[2].get_fd = local_58;
        memset(&ppVar6[2].set_completion_callback,0,(size_t)local_58);
        *async = ppVar6;
        iVar3 = do_sign_async(local_50,async);
        return iVar3;
      }
      *async = (ptls_async_job_t *)0x0;
      iVar3 = 0x201;
      goto LAB_0011e31b;
    }
    iVar3 = ptls_buffer_reserve(local_50,(size_t)local_58);
    if (iVar3 != 0) goto LAB_0011e31b;
    iVar4 = EVP_DigestSignFinal(ctx,ppVar9->base + ppVar9->off,(size_t *)&local_58);
  }
  iVar3 = iVar8;
  if (iVar4 == 1) {
    ppVar9->off = (size_t)(local_58 + ppVar9->off);
    iVar3 = 0;
  }
LAB_0011e31b:
  EVP_MD_CTX_free(ctx);
  return iVar3;
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                            ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const ptls_openssl_signature_scheme_t *scheme;

    /* Just resume the asynchronous operation, if one is in flight. */
#if PTLS_OPENSSL_HAVE_ASYNC
    if (async != NULL && *async != NULL) {
        struct async_sign_ctx *sign_ctx = (struct async_sign_ctx *)(*async);
        *selected_algorithm = sign_ctx->scheme->scheme_id;
        return do_sign_async(outbuf, async);
    }
#endif

    /* Select the algorithm or return failure if none found. */
    if ((scheme = ptls_openssl_select_signature_scheme(self->schemes, algorithms, num_algorithms)) == NULL)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    *selected_algorithm = scheme->scheme_id;

#if PTLS_OPENSSL_HAVE_ASYNC
    if (!self->async && async != NULL) {
        /* indicate to `do_sign` that async mode is disabled for this operation */
        assert(*async == NULL);
        async = NULL;
    }
#endif
    return do_sign(self->key, scheme, outbuf, input, async);
}